

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O1

void * CSocekt::ServerRecyConnectionThread(void *threadData)

{
  list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *plVar1;
  size_t *psVar2;
  CSocekt *this;
  lp_connection_t pfVar3;
  int iVar4;
  time_t tVar5;
  _List_node_base *p_Var6;
  SourceFile file;
  Logger LStack_1008;
  
  this = *(CSocekt **)((long)threadData + 8);
  plVar1 = &this->m_recyconnectionList;
  do {
    usleep(200000);
    LOCK();
    iVar4 = (this->m_total_recyconnection_n).value_;
    if (iVar4 == 0) {
      (this->m_total_recyconnection_n).value_ = 0;
      iVar4 = 0;
    }
    UNLOCK();
    if (0 < iVar4) {
      tVar5 = time((time_t *)0x0);
      muduo::MutexLock::lock(&this->m_recyconnqueueMutex);
      p_Var6 = (_List_node_base *)plVar1;
      while (p_Var6 = (((_List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
                       &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var6 != (_List_node_base *)plVar1) {
        pfVar3 = (lp_connection_t)p_Var6[1]._M_next;
        if (((long)this->m_RecyConnectionWaitTime + pfVar3->inRecyTime <= tVar5) ||
           (g_stopEvent != 0)) {
          LOCK();
          iVar4 = (pfVar3->iThrowsendCount).value_;
          if (iVar4 == 0) {
            (pfVar3->iThrowsendCount).value_ = 0;
            iVar4 = 0;
          }
          UNLOCK();
          if (0 < iVar4) {
            file._8_8_ = 0x13;
            file.data_ = "flyd_socket_conn.cc";
            muduo::Logger::Logger(&LStack_1008,file,0xf0,ERROR);
            if (0x6e < (uint)(((int)&LStack_1008 + 0xfb8) -
                             (int)LStack_1008.impl_.stream_.buffer_.cur_)) {
              memcpy(LStack_1008.impl_.stream_.buffer_.cur_,anon_var_dwarf_2e967,0x6e);
              LStack_1008.impl_.stream_.buffer_.cur_ = LStack_1008.impl_.stream_.buffer_.cur_ + 0x6e
              ;
            }
            muduo::Logger::~Logger(&LStack_1008);
          }
          LOCK();
          (this->m_total_recyconnection_n).value_ = (this->m_total_recyconnection_n).value_ + -1;
          UNLOCK();
          psVar2 = &(this->m_recyconnectionList).
                    super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>.
                    _M_impl._M_node._M_size;
          *psVar2 = *psVar2 - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var6);
          flyd_free_connection(this,pfVar3);
          p_Var6 = (_List_node_base *)plVar1;
        }
      }
      (this->m_recyconnqueueMutex).holder_ = 0;
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_recyconnqueueMutex);
    }
  } while (g_stopEvent != 1);
  LOCK();
  iVar4 = (this->m_total_recyconnection_n).value_;
  if (iVar4 == 0) {
    (this->m_total_recyconnection_n).value_ = 0;
    iVar4 = 0;
  }
  UNLOCK();
  if (0 < iVar4) {
    muduo::MutexLock::lock(&this->m_recyconnqueueMutex);
    while (p_Var6 = (this->m_recyconnectionList).
                    super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)&this->m_recyconnectionList) {
      pfVar3 = (lp_connection_t)p_Var6[1]._M_next;
      LOCK();
      (this->m_total_recyconnection_n).value_ = (this->m_total_recyconnection_n).value_ + -1;
      UNLOCK();
      psVar2 = &(this->m_recyconnectionList).
                super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
                _M_node._M_size;
      *psVar2 = *psVar2 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var6);
      flyd_free_connection(this,pfVar3);
    }
    (this->m_recyconnqueueMutex).holder_ = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_recyconnqueueMutex);
  }
  return (void *)0x0;
}

Assistant:

void* CSocekt::ServerRecyConnectionThread(void* threadData)
{
    ThreadItem *pThread = static_cast<ThreadItem*>(threadData);
    CSocekt *pSocketObj = pThread->_pThis;
    
    time_t currtime;
    int err;
    std::list<lp_connection_t>::iterator pos,posend;
    lp_connection_t p_Conn;
    
    while(1)
    {
        //为简化问题，我们直接每次休息200毫秒
        usleep(200 * 1000);  //单位是微妙,又因为1毫秒=1000微妙，所以 200 *1000 = 200毫秒

        //不管啥情况，先把这个条件成立时该做的动作做了
        if(pSocketObj->m_total_recyconnection_n.get() > 0)
        {
            currtime = time(NULL);
            muduo::MutexLockGuard lock(pSocketObj->m_recyconnqueueMutex);  
        //    if(err != 0) ngx_log_stderr(err,"CSocekt::ServerRecyConnectionThread()中pthread_mutex_lock()失败，返回的错误码为%d!",err);

lblRRTD:
            pos    = pSocketObj->m_recyconnectionList.begin();
			posend = pSocketObj->m_recyconnectionList.end();
            for(; pos != posend; ++pos)
            {
                p_Conn = (*pos);
                if(
                    ( (p_Conn->inRecyTime + pSocketObj->m_RecyConnectionWaitTime) > currtime)  && (g_stopEvent == 0) //如果不是要整个系统退出，你可以continue，否则就得要强制释放
                    )
                {
                    continue; //没到释放的时间
                }    
                //到释放的时间了: 
                //......这将来可能还要做一些是否能释放的判断[在我们写完发送数据代码之后吧]，先预留位置
                //....

                //我认为，凡是到释放时间的，iThrowsendCount都应该为0；这里我们加点日志判断下
                if(p_Conn->iThrowsendCount.get() > 0)
                {
                    //这确实不应该，打印个日志吧；
                   // ngx_log_stderr(0,"CSocekt::ServerRecyConnectionThread()中到释放时间却发现p_Conn.iThrowsendCount!=0，这个不该发生");
                    //其他先暂时啥也不敢，路程继续往下走，继续去释放吧。
                    LOG_ERROR << "CSocekt::ServerRecyConnectionThread()中到释放时间却发现p_Conn.iThrowsendCount!=0，这个不该发生";
                }

                //流程走到这里，表示可以释放，那我们就开始释放
                pSocketObj->m_total_recyconnection_n.decrement();        //待释放连接队列大小-1
                pSocketObj->m_recyconnectionList.erase(pos);   //迭代器已经失效，但pos所指内容在p_Conn里保存着呢

                //ngx_log_stderr(0,"CSocekt::ServerRecyConnectionThread()执行，连接%d被归还.",p_Conn->fd);

                pSocketObj->flyd_free_connection(p_Conn);	   //归还参数pConn所代表的连接到到连接池中
                goto lblRRTD; 
            } //end for
          //  err = pthread_mutex_unlock(&pSocketObj->m_recyconnqueueMutex); 
         //   if(err != 0)  LOG_ERROR << "CSocekt::ServerRecyConnectionThread()pthread_mutex_unlock()失败，返回的错误码为!" << err;
        } //end if

        if(g_stopEvent == 1) //要退出整个程序，那么肯定要先退出这个循环
        {
            if(pSocketObj->m_total_recyconnection_n.get() > 0)
            {
                muduo::MutexLockGuard lock(pSocketObj->m_recyconnqueueMutex);
                //因为要退出，所以就得硬释放了【不管到没到时间，不管有没有其他不 允许释放的需求，都得硬释放】
               // err = pthread_mutex_lock(&pSocketObj->m_recyconnqueueMutex);  
               // if(err != 0) ngx_log_stderr(err,"CSocekt::ServerRecyConnectionThread()中pthread_mutex_lock2()失败，返回的错误码为%d!",err);

        lblRRTD2:
                pos    = pSocketObj->m_recyconnectionList.begin();
			    posend = pSocketObj->m_recyconnectionList.end();
                for(; pos != posend; ++pos)
                {
                    p_Conn = (*pos);
                    pSocketObj->m_total_recyconnection_n.decrement();        //待释放连接队列大小-1
                    pSocketObj->m_recyconnectionList.erase(pos);   //迭代器已经失效，但pos所指内容在p_Conn里保存着呢
                    pSocketObj->flyd_free_connection(p_Conn);	   //归还参数pConn所代表的连接到到连接池中
                    goto lblRRTD2; 
                } //end for
                //err = pthread_mutex_unlock(&pSocketObj->m_recyconnqueueMutex); 
               // if(err != 0)  ngx_log_stderr(err,"CSocekt::ServerRecyConnectionThread()pthread_mutex_unlock2()失败，返回的错误码为%d!",err);
            } //end if
            break; //整个程序要退出了，所以break;
        }  //end if
    } //end while    
    
    return (void*)0;
}